

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O0

int __thiscall
CVmObjBigNum::getp_copy_sign(CVmObjBigNum *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  size_t sVar2;
  int in_ECX;
  vm_val_t *in_RDI;
  size_t prec;
  char *ext2;
  char *new_ext;
  vm_val_t val2;
  vm_val_t *in_stack_ffffffffffffff90;
  char *ext;
  char **in_stack_ffffffffffffff98;
  void *__src;
  uint *in_stack_ffffffffffffffa0;
  CVmObjBigNum *in_stack_ffffffffffffffb8;
  char *local_40;
  char **in_stack_ffffffffffffffd0;
  
  sVar2 = get_prec((char *)0x2b21cd);
  iVar1 = setup_getp_1(in_stack_ffffffffffffffb8,(vm_obj_id_t)(sVar2 >> 0x20),in_RDI,
                       in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90
                       ,in_stack_ffffffffffffffd0,in_ECX);
  if (iVar1 == 0) {
    __src = (in_RDI->val).ptr;
    ext = local_40;
    sVar2 = calc_alloc(sVar2);
    memcpy(ext,__src,sVar2);
    iVar1 = get_neg((char *)in_stack_ffffffffffffffb8);
    set_neg(local_40,iVar1);
    normalize(ext);
    CVmStack::discard(2);
  }
  return 1;
}

Assistant:

int CVmObjBigNum::getp_copy_sign(VMG_ vm_obj_id_t self,
                                 vm_val_t *retval, uint *argc)
{
    vm_val_t val2;
    char *new_ext;
    const char *ext2;
    size_t prec = get_prec(ext_);

    if (setup_getp_1(vmg_ self, retval, argc, &new_ext,
                     &val2, &ext2, TRUE))
        return TRUE;

    /* make a copy of my value in the new object */
    memcpy(new_ext, ext_, calc_alloc(prec));

    /* set the sign from the other object */
    set_neg(new_ext, get_neg(ext2));

    /* 
     *   normalize it (this is important when the value was zero to start
     *   with, since zero is always represented without a negative sign) 
     */
    normalize(new_ext);

    /* remove the GC protection */
    G_stk->discard(2);

    /* handled */
    return TRUE;
}